

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
capnp::List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
          (Builder *this,uint index,initializer_list<int> value)

{
  ulong uVar1;
  long lVar2;
  Builder l;
  ListBuilder local_50;
  PointerBuilder local_28;
  
  local_28.pointer =
       (WirePointer *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
  local_28.segment = (this->builder).segment;
  local_28.capTable = (this->builder).capTable;
  capnp::_::PointerBuilder::initList(&local_50,&local_28,FOUR_BYTES,(ElementCount)value._M_len);
  if (value._M_len != 0) {
    lVar2 = value._M_len << 2;
    uVar1 = 0;
    do {
      *(int *)(local_50.ptr + ((uVar1 & 0xffffffff) * (ulong)local_50.step >> 3)) =
           value._M_array[uVar1];
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + -4;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void set(uint index, std::initializer_list<ReaderFor<T>> value) {
      KJ_IREQUIRE(index < size());
      auto l = init(index, value.size());
      uint i = 0;
      for (auto& element: value) {
        l.set(i++, element);
      }
    }